

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

double __thiscall Graph::minVoltage(Graph *this)

{
  double dVar1;
  Vertex *local_20;
  Vertex *no;
  double tension_minimum;
  Graph *this_local;
  
  no = (Vertex *)0x3ff0000000000000;
  for (local_20 = this->verticesList; local_20 != (Vertex *)0x0;
      local_20 = Vertex::getNext(local_20)) {
    dVar1 = Vertex::getVoltage(local_20);
    if (dVar1 < (double)no) {
      no = (Vertex *)Vertex::getVoltage(local_20);
    }
  }
  return (double)no;
}

Assistant:

double Graph::minVoltage(){
    double tension_minimum = 1.0;
    for(Vertex *no=this->verticesList; no!=NULL; no= no->getNext()){
        if(no->getVoltage() < tension_minimum)
            tension_minimum = no->getVoltage();
    }
    return tension_minimum;
}